

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t archive_write_mtree_finish_entry(archive_write *a)

{
  mtree_writer *mtree_00;
  mtree_entry_conflict *pmVar1;
  mtree_entry_conflict *me;
  mtree_writer *mtree;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  pmVar1 = mtree_00->mtree_entry;
  if ((pmVar1 != (mtree_entry_conflict *)0x0) &&
     (mtree_00->mtree_entry = (mtree_entry_conflict *)0x0, pmVar1->reg_info != (reg_info *)0x0)) {
    sum_final(mtree_00,pmVar1->reg_info);
  }
  return L'\0';
}

Assistant:

static int
archive_write_mtree_finish_entry(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *me;

	if ((me = mtree->mtree_entry) == NULL)
		return (ARCHIVE_OK);
	mtree->mtree_entry = NULL;

	if (me->reg_info)
		sum_final(mtree, me->reg_info);

	return (ARCHIVE_OK);
}